

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_eval.cpp
# Opt level: O0

ON_Plane * __thiscall
ON_SubDVertex::VertexFrame
          (ON_Plane *__return_storage_ptr__,ON_SubDVertex *this,
          ON_SubDComponentLocation subd_appearance)

{
  double d;
  bool bVar1;
  uint uVar2;
  ON_Plane *local_328;
  ON_SubDFace *local_308;
  ON_3dVector local_2d0;
  ON_3dVector local_2b8;
  ON_3dPoint local_2a0;
  undefined1 auStack_288 [8];
  ON_3dVector Y;
  undefined1 local_268 [8];
  ON_SubDSectorSurfacePoint limit_point;
  ON_3dVector local_1e0;
  ON_3dVector local_1c8;
  ON_3dVector local_1b0;
  undefined1 auStack_198 [8];
  ON_3dVector X;
  ON_3dPoint local_168;
  ON_3dPoint local_150;
  ON_3dPoint local_138;
  ON_3dVector local_120;
  ON_3dVector local_108;
  ON_SubDFace *local_f0;
  ON_SubDFace *f;
  ON_SubDVertex *v1;
  ON_SubDEdge *local_d0;
  ON_SubDEdge *e;
  undefined1 auStack_c0 [4];
  int vei;
  ON_3dVector V;
  ON_Plane vertex_frame;
  ON_SubDFace *sector_face;
  ON_SubDComponentLocation subd_appearance_local;
  ON_SubDVertex *this_local;
  
  uVar2 = FaceCount(this);
  if (uVar2 == 0) {
    memcpy(__return_storage_ptr__,&ON_Plane::NanPlane,0x80);
    return __return_storage_ptr__;
  }
  vertex_frame.plane_equation.d = (double)Face(this,0);
  if ((ON_SubDFace *)vertex_frame.plane_equation.d == (ON_SubDFace *)0x0) {
    memcpy(__return_storage_ptr__,&ON_Plane::NanPlane,0x80);
    return __return_storage_ptr__;
  }
  memcpy(&V.z,&ON_Plane::NanPlane,0x80);
  if (subd_appearance == ControlNet) {
    _auStack_c0 = ON_3dVector::ZeroVector.x;
    V.x = ON_3dVector::ZeroVector.y;
    V.y = ON_3dVector::ZeroVector.z;
    for (e._4_4_ = 0; (int)e._4_4_ < (int)(uint)this->m_edge_count; e._4_4_ = e._4_4_ + 1) {
      local_d0 = Edge(this,e._4_4_);
      if ((local_d0 != (ON_SubDEdge *)0x0) &&
         (f = (ON_SubDFace *)ON_SubDEdge::OtherEndVertex(local_d0,this),
         (ON_SubDVertex *)f != (ON_SubDVertex *)0x0)) {
        if (local_d0->m_face_count == 1) {
          local_308 = ON_SubDEdge::Face(local_d0,0);
        }
        else {
          local_308 = (ON_SubDFace *)0x0;
        }
        local_f0 = local_308;
        if (local_308 != (ON_SubDFace *)0x0) {
          vertex_frame.plane_equation.d = (double)local_308;
          ControlNetPoint(&local_138,(ON_SubDVertex *)f);
          ControlNetPoint(&local_150,this);
          ON_3dPoint::operator-(&local_120,&local_138,&local_150);
          ON_3dVector::UnitVector(&local_108,&local_120);
          _auStack_c0 = local_108.x;
          V.x = local_108.y;
          V.y = local_108.z;
          break;
        }
      }
    }
    ControlNetPoint(&local_168,this);
    ON_SubDFace::ControlNetCenterNormal
              ((ON_3dVector *)&X.z,(ON_SubDFace *)vertex_frame.plane_equation.d);
    ON_Plane::CreateFromNormal((ON_Plane *)&V.z,&local_168,(ON_3dVector *)&X.z);
    d = ON_3dVector::operator*((ON_3dVector *)auStack_c0,(ON_3dVector *)&vertex_frame.yaxis.z);
    ::operator*(&local_1c8,d,(ON_3dVector *)&vertex_frame.yaxis.z);
    ON_3dVector::operator-(&local_1b0,(ON_3dVector *)auStack_c0,&local_1c8);
    ON_3dVector::UnitVector((ON_3dVector *)auStack_198,&local_1b0);
    bVar1 = ON_3dVector::IsUnitVector((ON_3dVector *)auStack_198);
    if (bVar1) {
      vertex_frame.xaxis.y = X.y;
      vertex_frame.origin.z = (double)auStack_198;
      vertex_frame.xaxis.x = X.x;
      ON_CrossProduct((ON_3dVector *)&limit_point.m_sector_face,(ON_3dVector *)&vertex_frame.yaxis.z
                      ,(ON_3dVector *)&vertex_frame.origin.z);
      ON_3dVector::UnitVector(&local_1e0,(ON_3dVector *)&limit_point.m_sector_face);
      vertex_frame.xaxis.z = local_1e0.x;
      vertex_frame.yaxis.x = local_1e0.y;
      vertex_frame.yaxis.y = local_1e0.z;
    }
  }
  else {
    uVar2 = FaceCount(this);
    if ((uVar2 != 0) &&
       (bVar1 = GetSurfacePoint(this,(ON_SubDFace *)vertex_frame.plane_equation.d,
                                (ON_SubDSectorSurfacePoint *)local_268), !bVar1)) {
      memcpy(__return_storage_ptr__,&ON_Plane::NanPlane,0x80);
      goto LAB_008d2476;
    }
    ON_CrossProduct((ON_3dVector *)auStack_288,limit_point.m_limitT2 + 2,limit_point.m_limitP + 2);
    ON_3dVector::Unitize((ON_3dVector *)auStack_288);
    ON_3dPoint::ON_3dPoint(&local_2a0,(double *)local_268);
    ON_3dVector::ON_3dVector(&local_2b8,limit_point.m_limitT2 + 2);
    ON_Plane::CreateFromNormal((ON_Plane *)&V.z,&local_2a0,&local_2b8);
    vertex_frame.yaxis.y = Y.y;
    vertex_frame.xaxis.z = (double)auStack_288;
    vertex_frame.yaxis.x = Y.x;
    ON_CrossProduct(&local_2d0,(ON_3dVector *)&vertex_frame.xaxis.z,
                    (ON_3dVector *)&vertex_frame.yaxis.z);
    vertex_frame.xaxis.y = local_2d0.z;
    vertex_frame.origin.z = local_2d0.x;
    vertex_frame.xaxis.x = local_2d0.y;
    ON_3dVector::Unitize((ON_3dVector *)&vertex_frame.origin.z);
  }
  bVar1 = ON_Plane::IsValid((ON_Plane *)&V.z);
  if (bVar1) {
    local_328 = (ON_Plane *)&V.z;
  }
  else {
    local_328 = &ON_Plane::NanPlane;
  }
  memcpy(__return_storage_ptr__,local_328,0x80);
LAB_008d2476:
  Y.z._4_4_ = 1;
  ON_Plane::~ON_Plane((ON_Plane *)&V.z);
  return __return_storage_ptr__;
}

Assistant:

const ON_Plane ON_SubDVertex::VertexFrame(
  ON_SubDComponentLocation subd_appearance
) const
{
  if (0 == FaceCount())
    return ON_Plane::NanPlane;

  const ON_SubDFace* sector_face = Face(0);
  if (nullptr == sector_face)
    return ON_Plane::NanPlane;

  ON_Plane vertex_frame(ON_Plane::NanPlane);
  if (ON_SubDComponentLocation::ControlNet == subd_appearance)
  {
    ON_3dVector V = ON_3dVector::ZeroVector;
    for (int vei = 0; vei < m_edge_count; ++vei)
    {
      const ON_SubDEdge* e = Edge(vei);
      if (nullptr == e)
        continue;
      const ON_SubDVertex* v1 = e->OtherEndVertex(this);
      if (nullptr == v1)
        continue;
      const ON_SubDFace* f = (1 == e->m_face_count) ? e->Face(0) : nullptr;
      if (nullptr == f)
        continue;
      sector_face = f;
      V = (v1->ControlNetPoint() - ControlNetPoint()).UnitVector();
      break;
    }
    vertex_frame.CreateFromNormal(ControlNetPoint(), sector_face->ControlNetCenterNormal());
    const ON_3dVector X = (V - (V * vertex_frame.zaxis) * vertex_frame.zaxis).UnitVector();
    if (X.IsUnitVector())
    {
      vertex_frame.xaxis = X;
      vertex_frame.yaxis = ON_CrossProduct(vertex_frame.zaxis, vertex_frame.xaxis).UnitVector();
    }
  }
  else
  {
    // If this is a smooth vertex or a crease vertex on the boundary,
    // then the sector_face does not matter. Otherwise it picks the
    // "side of the crease" for the normal.
    ON_SubDSectorSurfacePoint limit_point;
    if (FaceCount())
      if (false == GetSurfacePoint(sector_face, limit_point))
        return ON_Plane::NanPlane;

    ON_3dVector Y(ON_CrossProduct(limit_point.m_limitN, limit_point.m_limitT1));
    Y.Unitize();

    // The normal is more important than the tangent direction. 
    vertex_frame.CreateFromNormal(ON_3dPoint(limit_point.m_limitP), ON_3dVector(limit_point.m_limitN));
    vertex_frame.yaxis = Y;
    vertex_frame.xaxis = ON_CrossProduct(vertex_frame.yaxis, vertex_frame.zaxis);
    vertex_frame.xaxis.Unitize();
  }

  return vertex_frame.IsValid() ? vertex_frame : ON_Plane::NanPlane;
}